

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Unsubtyping::analyzeCasts(Unsubtyping *this)

{
  HeapType right;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  reference pHVar4;
  HeapType dest;
  iterator __end4;
  iterator __begin4;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *__range4;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
  local_48;
  iterator destsIt;
  HeapType src;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_30;
  iterator srcIt;
  HeapType type;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_18;
  iterator it;
  Unsubtyping *this_local;
  
  it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)this;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
       ::begin(&this->supertypes);
  while( true ) {
    type.id = (uintptr_t)
              std::
              unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
              ::end(&this->supertypes);
    bVar1 = std::__detail::operator!=
                      (&local_18,
                       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> *
                       )&type);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                         *)&local_18);
    srcIt.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)
         (ppVar2->first).id;
    local_30._M_cur = local_18._M_cur;
    while( true ) {
      src.id = (uintptr_t)
               std::
               unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
               ::end(&this->supertypes);
      bVar1 = std::__detail::operator!=
                        (&local_30,
                         (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                          *)&src);
      if (!bVar1) break;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                           *)&local_30);
      destsIt.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
                 )(ppVar2->second).id;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
           ::find(&this->castTypes,(key_type *)&destsIt);
      __range4 = (unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                  *)std::
                    unordered_map<wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                    ::end(&this->castTypes);
      bVar1 = std::__detail::operator==
                        (&local_48,
                         (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_true>
                          *)&__range4);
      if (!bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_false,_true>
                               *)&local_48);
        __end4 = std::
                 unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                 ::begin(&ppVar3->second);
        dest.id = (uintptr_t)
                  std::
                  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                  ::end(&ppVar3->second);
        while (bVar1 = std::__detail::operator!=
                                 (&__end4.super__Node_iterator_base<wasm::HeapType,_true>,
                                  (_Node_iterator_base<wasm::HeapType,_true> *)&dest), bVar1) {
          pHVar4 = std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator*(&__end4);
          right.id = pHVar4->id;
          bVar1 = HeapType::isSubType((HeapType)
                                      srcIt.
                                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                                      ._M_cur,right);
          if (bVar1) {
            noteSubtype(this,(HeapType)
                             srcIt.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                             ._M_cur,right);
          }
          std::__detail::_Node_iterator<wasm::HeapType,_true,_true>::operator++(&__end4);
        }
      }
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                           *)&local_30);
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
           ::find(&this->supertypes,&ppVar2->second);
    }
    std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
    operator++((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true> *)
               &local_18);
  }
  return;
}

Assistant:

void analyzeCasts() {
    // For each cast (src, dest) pair, any type that remains a subtype of src
    // (meaning its values can inhabit locations typed src) and that was
    // originally a subtype of dest (meaning its values would have passed the
    // cast) should remain a subtype of dest so that its values continue to pass
    // the cast.
    //
    // For every type, walk up its new supertype chain to find cast sources and
    // compare against their associated cast destinations.
    for (auto it = supertypes.begin(); it != supertypes.end(); ++it) {
      auto type = it->first;
      for (auto srcIt = it; srcIt != supertypes.end();
           srcIt = supertypes.find(srcIt->second)) {
        auto src = srcIt->second;
        auto destsIt = castTypes.find(src);
        if (destsIt == castTypes.end()) {
          continue;
        }
        for (auto dest : destsIt->second) {
          if (HeapType::isSubType(type, dest)) {
            noteSubtype(type, dest);
          }
        }
      }
    }
  }